

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::CaseGenerateSyntax::getChild(CaseGenerateSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  undefined8 in_RDX;
  long in_RSI;
  TokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff68;
  TokenOrSyntax *in_stack_ffffffffffffff70;
  nullptr_t in_stack_ffffffffffffff78;
  Info *in_stack_ffffffffffffff80;
  
  switch(in_RDX) {
  case 0:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    break;
  case 1:
    token.info = in_stack_ffffffffffffff80;
    token._0_8_ = in_stack_ffffffffffffff78;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff70,token);
    break;
  case 2:
    token_00.info = in_stack_ffffffffffffff80;
    token_00._0_8_ = in_stack_ffffffffffffff78;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff70,token_00);
    break;
  case 3:
    not_null<slang::syntax::ExpressionSyntax_*>::get
              ((not_null<slang::syntax::ExpressionSyntax_*> *)(in_RSI + 0x70));
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    break;
  case 4:
    token_01.info = in_stack_ffffffffffffff80;
    token_01._0_8_ = in_stack_ffffffffffffff78;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff70,token_01);
    break;
  case 5:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0x88),in_stack_ffffffffffffff68);
    break;
  case 6:
    token_02.info = in_stack_ffffffffffffff80;
    token_02._0_8_ = in_stack_ffffffffffffff78;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff70,token_02);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax
              ((TokenOrSyntax *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  return in_RDI;
}

Assistant:

TokenOrSyntax CaseGenerateSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return keyword;
        case 2: return openParen;
        case 3: return condition.get();
        case 4: return closeParen;
        case 5: return &items;
        case 6: return endCase;
        default: return nullptr;
    }
}